

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

bool MeCab::anon_unknown_20::connect<false>
               (size_t pos,Node *rnode,Node **begin_node_list,Node **end_node_list,
               Connector *connector,Allocator<mecab_node_t,_mecab_path_t> *allocator)

{
  mecab_node_t **ppmVar1;
  Node *pNVar2;
  long lVar3;
  Node *pNVar4;
  mecab_node_t **ppmVar5;
  long lVar6;
  
  ppmVar1 = begin_node_list + pos;
  for (; rnode != (mecab_node_t *)0x0; rnode = rnode->bnext) {
    lVar3 = 0x7fffffff;
    pNVar4 = (Node *)0x0;
    ppmVar5 = ppmVar1;
    while (pNVar2 = *ppmVar5, pNVar2 != (Node *)0x0) {
      lVar6 = (long)rnode->wcost +
              (long)*(short *)((long)&end_node_list[3]->prev +
                              (ulong)pNVar2->rcAttr * 2 +
                              (ulong)rnode->lcAttr * (ulong)*(ushort *)(end_node_list + 4) * 2) +
              pNVar2->cost;
      if (lVar6 < lVar3) {
        lVar3 = lVar6;
        pNVar4 = pNVar2;
      }
      ppmVar5 = &pNVar2->enext;
    }
    if (pNVar4 == (Node *)0x0) break;
    rnode->prev = pNVar4;
    rnode->next = (mecab_node_t *)0x0;
    rnode->cost = lVar3;
    rnode->enext = ppmVar1[rnode->rlength];
    ppmVar1[rnode->rlength] = rnode;
  }
  return rnode == (mecab_node_t *)0x0;
}

Assistant:

bool connect(size_t pos, Node *rnode,
                                       Node **begin_node_list,
                                       Node **end_node_list,
                                       const Connector *connector,
                                       Allocator<Node, Path> *allocator) {
  for (;rnode; rnode = rnode->bnext) {
    register long best_cost = 2147483647;
    Node* best_node = 0;
    for (Node *lnode = end_node_list[pos]; lnode; lnode = lnode->enext) {
      register int lcost = connector->cost(lnode, rnode);  // local cost
      register long cost = lnode->cost + lcost;

      if (cost < best_cost) {
        best_node  = lnode;
        best_cost  = cost;
  }

      if (IsAllPath) {
        Path *path   = allocator->newPath();
        path->cost   = lcost;
        path->rnode  = rnode;
        path->lnode  = lnode;
        path->lnext  = rnode->lpath;
        rnode->lpath = path;
        path->rnext  = lnode->rpath;
        lnode->rpath = path;
      }
    }

    // overflow check 2003/03/09
    if (!best_node) {
      return false;
  }

    rnode->prev = best_node;
    rnode->next = 0;
    rnode->cost = best_cost;
    const size_t x = rnode->rlength + pos;
    rnode->enext = end_node_list[x];
    end_node_list[x] = rnode;
  }

  return true;
  }